

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::clara::TextFlow::Columns::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  long lVar1;
  pointer pCVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string col;
  string padding;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  lVar5 = 0;
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  padding._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  padding.field_2._M_local_buf[0] = '\0';
  uVar6 = 0;
  while( true ) {
    pCVar2 = (this->m_columns->
             super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_columns->
                       super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0x30) <= uVar6)
    break;
    col._M_dataplus._M_p =
         (pointer)((long)&(pCVar2->m_strings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + lVar5);
    uVar3 = *(ulong *)((long)&pCVar2->m_width + lVar5);
    col._M_string_length =
         *(long *)((long)&(pCVar2->m_strings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + lVar5 + 8) -
         *(long *)((long)&(pCVar2->m_strings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + lVar5) >> 5;
    col.field_2._M_allocated_capacity = 0;
    col.field_2._M_local_buf[8] = '\0';
    col.field_2._9_7_ = 0;
    bVar4 = Column::iterator::operator!=
                      ((iterator *)
                       ((long)&((this->m_iterators).
                                super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_column + lVar5),
                       (iterator *)&col);
    if (bVar4) {
      Column::iterator::operator*[abi_cxx11_
                (&col,(iterator *)
                      ((long)&((this->m_iterators).
                               super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_column + lVar5));
      ::std::operator+(&local_a8,&padding,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&col);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_a8);
      if (uVar3 < col._M_string_length || uVar3 - col._M_string_length == 0) {
        ::std::__cxx11::string::assign((char *)&padding);
      }
      else {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_a8,(char)(uVar3 - col._M_string_length));
        ::std::__cxx11::string::operator=((string *)&padding,(string *)&local_a8);
        ::std::__cxx11::string::~string((string *)&local_a8);
      }
    }
    else {
      col._M_dataplus._M_p = (pointer)&col.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&col,(char)uVar3);
      ::std::__cxx11::string::append((string *)&padding);
    }
    ::std::__cxx11::string::~string((string *)&col);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x30;
  }
  ::std::__cxx11::string::~string((string *)&padding);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

auto operator *() const -> std::string {
			std::string row, padding;

			for (size_t i = 0; i < m_columns.size(); ++i) {
				auto width = m_columns[i].width();
				if (m_iterators[i] != m_columns[i].end()) {
					std::string col = *m_iterators[i];
					row += padding + col;
					if (col.size() < width)
						padding = std::string(width - col.size(), ' ');
					else
						padding = "";
				} else {
					padding += std::string(width, ' ');
				}
			}
			return row;
		}